

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_input_has_mouse_click_in_rect(nk_input *i,nk_buttons id,nk_rect b)

{
  nk_mouse_button *btn;
  nk_buttons id_local;
  nk_input *i_local;
  float fStack_18;
  nk_rect b_local;
  
  if (i == (nk_input *)0x0) {
    b_local.w = 0.0;
  }
  else {
    i_local._4_4_ = b.x;
    if (((((i->mouse).buttons[id].clicked_pos.x < i_local._4_4_) ||
         (b_local.x = b.w, i_local._4_4_ + b_local.x <= (i->mouse).buttons[id].clicked_pos.x)) ||
        (fStack_18 = b.y, (i->mouse).buttons[id].clicked_pos.y < fStack_18)) ||
       (b_local.y = b.h, fStack_18 + b_local.y <= (i->mouse).buttons[id].clicked_pos.y)) {
      b_local.w = 0.0;
    }
    else {
      b_local.w = 1.4013e-45;
    }
  }
  return (int)b_local.w;
}

Assistant:

NK_API int
nk_input_has_mouse_click_in_rect(const struct nk_input *i, enum nk_buttons id,
    struct nk_rect b)
{
    const struct nk_mouse_button *btn;
    if (!i) return nk_false;
    btn = &i->mouse.buttons[id];
    if (!NK_INBOX(btn->clicked_pos.x,btn->clicked_pos.y,b.x,b.y,b.w,b.h))
        return nk_false;
    return nk_true;
}